

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Create.c
# Opt level: O0

void tge_destroy(tgestate_t *state)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    free(*(void **)((long)in_RDI + 0x7a8));
    free(*(void **)((long)in_RDI + 0x7a0));
    free(*(void **)((long)in_RDI + 0x790));
    free(in_RDI);
  }
  return;
}

Assistant:

TGE_API void tge_destroy(tgestate_t *state)
{
  if (state == NULL)
    return;

  free(state->map_buf);
  free(state->window_buf);
  free(state->tile_buf);

  free(state);
}